

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

void __thiscall nivalis::Plotter::reparse_expr(Plotter *this,size_t idx)

{
  char cVar1;
  string_view expr_00;
  string_view expr_01;
  initializer_list<unsigned_long> __l;
  anon_union_8_3_343d95dd_for_ASTNode_1 aVar2;
  ulong uVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint64_t uVar9;
  size_type sVar10;
  char *pcVar11;
  reference pvVar12;
  iterator expr_02;
  iterator arg_bindings;
  iterator puVar13;
  long lVar14;
  Plotter *pPVar15;
  Plotter *in_RSI;
  byte *in_RDI;
  undefined1 auVar16 [16];
  size_t i_1;
  Expr *point_expr;
  iterator __end1;
  iterator __begin1;
  vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *__range1;
  uint64_t var;
  uint64_t addr_2;
  Expr expr;
  uint64_t addr_1;
  string arg_1;
  uint64_t addr;
  string arg;
  char cc;
  int64_t i;
  bool bad;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bindings;
  size_t non_space_count;
  size_t argcount;
  int64_t last_begin;
  int64_t stkh;
  string funname;
  size_t funname_end;
  size_t rad_end_pos_2;
  size_t rad_end_pos_1;
  size_t rad_end_pos;
  bool want_reparse_all;
  int ftype_nomod;
  string rhs;
  string lhs;
  value_type *func;
  string *in_stack_00001248;
  Expr *in_stack_fffffffffffff9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c0;
  Plotter *pPVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c8;
  string *in_stack_fffffffffffff9d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  reference __a;
  allocator<char> *in_stack_fffffffffffff9f0;
  Expr *this_01;
  char *in_stack_fffffffffffff9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa00;
  char *in_stack_fffffffffffffa08;
  uint local_5e8;
  string *in_stack_fffffffffffffa20;
  Environment *in_stack_fffffffffffffa28;
  string *in_stack_fffffffffffffa30;
  undefined7 in_stack_fffffffffffffa38;
  undefined1 in_stack_fffffffffffffa3f;
  size_t in_stack_fffffffffffffa80;
  string *this_02;
  undefined8 in_stack_fffffffffffffa88;
  undefined2 uVar18;
  undefined7 in_stack_fffffffffffffa90;
  undefined1 in_stack_fffffffffffffa97;
  string *in_stack_fffffffffffffa98;
  string *psVar19;
  Plotter *local_4f8;
  undefined1 local_4e9 [49];
  reference local_4b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffb50;
  __normal_iterator<nivalis::Expr_*,_std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>_>
  in_stack_fffffffffffffb58;
  string *in_stack_fffffffffffffb60;
  uint32_t in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  Environment *in_stack_fffffffffffffb78;
  Function *in_stack_fffffffffffffb80;
  string *in_stack_fffffffffffffb88;
  string *in_stack_fffffffffffffba0;
  undefined1 local_458 [32];
  anon_union_8_3_343d95dd_for_ASTNode_1 local_438;
  ulong local_400;
  string *local_3f8;
  string local_3d8 [32];
  string local_3b8 [32];
  string *local_398;
  undefined1 local_390 [16];
  string local_380 [32];
  uint64_t local_360;
  int local_354;
  undefined1 local_350 [16];
  string local_340 [39];
  char local_319;
  ulong local_318;
  byte local_309;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  string local_2d0 [32];
  ulong local_2b0;
  string local_2a8 [32];
  string local_288 [32];
  long local_268;
  string local_260 [32];
  string local_240 [32];
  long local_220;
  string local_218 [56];
  string local_1e0 [32];
  long local_1c0;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [83];
  byte local_105;
  uint local_104;
  string local_100 [32];
  string local_e0;
  string local_c0;
  reference local_a0;
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [16];
  string *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  allocator<char> local_31;
  string local_30 [24];
  size_t in_stack_ffffffffffffffe8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  uVar9 = Environment::addr_of
                    ((Environment *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
                     in_stack_fffffffffffffa30,SUB81((ulong)in_stack_fffffffffffffa28 >> 0x38,0));
  *(int *)(in_RDI + 0x310) = (int)uVar9;
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  uVar9 = Environment::addr_of
                    ((Environment *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
                     in_stack_fffffffffffffa30,SUB81((ulong)in_stack_fffffffffffffa28 >> 0x38,0));
  *(int *)(in_RDI + 0x314) = (int)uVar9;
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  uVar9 = Environment::addr_of
                    ((Environment *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
                     in_stack_fffffffffffffa30,SUB81((ulong)in_stack_fffffffffffffa28 >> 0x38,0));
  *(int *)(in_RDI + 0x318) = (int)uVar9;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  local_a0 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                       ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                        (in_RDI + 0x40),(size_type)in_RSI);
  std::__cxx11::string::clear();
  std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::clear
            ((vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)0x13d273);
  std::__cxx11::string::string((string *)&local_c0);
  std::__cxx11::string::string((string *)&local_e0);
  if ((*in_RDI & 1) == 0) {
    std::__cxx11::string::string(local_100,(string *)&local_a0->expr_str);
  }
  else {
    latex_to_nivalis(in_stack_00001248);
  }
  iVar6 = anon_unknown_10::detect_func_type
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_a0->type = iVar6;
  std::__cxx11::string::~string(local_100);
  uVar18 = (undefined2)((ulong)in_stack_fffffffffffffa88 >> 0x30);
  uVar7 = local_a0->type & 0xfffffff8;
  local_105 = 0;
  local_104 = uVar7;
  if ((uVar7 != 0) && (uVar7 != 8)) {
    if (uVar7 == 0x10) {
      std::operator+(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
      std::operator+(in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
      std::operator+(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
      std::operator+(in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
      in_stack_fffffffffffff9b8 = (Expr *)(in_RDI + 0x58);
      parse(in_stack_fffffffffffffa98,
            (Environment *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
            SUB21((ushort)uVar18 >> 8,0),SUB21(uVar18,0),in_stack_fffffffffffffa80,
            (string *)CONCAT44(iVar6,uVar7));
      Expr::operator=((Expr *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      Expr::~Expr((Expr *)0x13d6fb);
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_1b8);
      goto LAB_0013e4bd;
    }
    if (uVar7 != 0x18) {
      if (uVar7 == 0x40) {
        local_2b0 = std::__cxx11::string::find((char)&local_c0,0x28);
        std::__cxx11::string::substr((ulong)local_2d0,(ulong)&local_c0);
        util::trim((string *)0x13de42);
        local_2d8 = 0;
        local_2e0 = local_2b0 + 1;
        local_2e8 = 0;
        local_2f0 = 0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x13de89);
        local_309 = 0;
        local_318 = local_2b0;
        do {
          do {
            while( true ) {
              while( true ) {
                while( true ) {
                  local_318 = local_318 + 1;
                  uVar3 = local_318;
                  lVar14 = std::__cxx11::string::size();
                  uVar18 = (undefined2)((ulong)in_stack_fffffffffffffa88 >> 0x30);
                  if (lVar14 - 1U <= uVar3) goto LAB_0013e150;
                  pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)&local_c0);
                  local_319 = *pcVar11;
                  if (local_319 != '(') break;
                  local_2d8 = local_2d8 + 1;
                }
                if (local_319 != ')') break;
                local_2d8 = local_2d8 + -1;
              }
              if (local_319 == ',') break;
              iVar8 = isspace((int)local_319);
              if (iVar8 == 0) {
                local_2f0 = local_2f0 + 1;
              }
            }
          } while (local_2d8 != 0);
          std::__cxx11::string::substr((ulong)local_340,(ulong)&local_c0);
          util::trim((string *)0x13dfdf);
          auVar16 = std::__cxx11::string::operator_cast_to_basic_string_view(local_340);
          expr_00._M_str = (char *)in_stack_fffffffffffff9c8;
          expr_00._M_len = (size_t)in_stack_fffffffffffff9c0;
          local_350 = auVar16;
          bVar5 = util::is_varname(expr_00);
          if (bVar5) {
            local_360 = Environment::addr_of
                                  ((Environment *)
                                   CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38),
                                   in_stack_fffffffffffffa30,
                                   SUB81((ulong)in_stack_fffffffffffffa28 >> 0x38,0));
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffff9d0,(value_type_conflict1 *)in_stack_fffffffffffff9c8);
            local_2e0 = local_318 + 1;
            local_2e8 = local_2e8 + 1;
            local_354 = 0;
          }
          else {
            local_309 = 1;
            local_354 = 3;
          }
          std::__cxx11::string::~string(local_340);
          uVar18 = (undefined2)((ulong)in_stack_fffffffffffffa88 >> 0x30);
        } while (local_354 == 0);
LAB_0013e150:
        auVar16._8_8_ = local_390._8_8_;
        auVar16._0_8_ = local_390._0_8_;
        if (((local_309 & 1) == 0) && (local_390 = auVar16, local_2f0 != 0)) {
          local_2e8 = local_2e8 + 1;
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_380,(ulong)&local_c0);
          util::trim((string *)0x13e1df);
          local_390 = std::__cxx11::string::operator_cast_to_basic_string_view(local_380);
          expr_01._M_str = (char *)in_stack_fffffffffffff9c8;
          expr_01._M_len = (size_t)in_stack_fffffffffffff9c0;
          bVar5 = util::is_varname(expr_01);
          if (bVar5) {
            in_stack_fffffffffffffa30 =
                 (string *)
                 Environment::addr_of
                           ((Environment *)CONCAT17(bVar5,in_stack_fffffffffffffa38),
                            in_stack_fffffffffffffa30,
                            SUB81((ulong)in_stack_fffffffffffffa28 >> 0x38,0));
            local_398 = in_stack_fffffffffffffa30;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffff9d0,(value_type_conflict1 *)in_stack_fffffffffffff9c8);
          }
          else {
            local_309 = 1;
          }
          std::__cxx11::string::~string(local_380);
        }
        if ((local_309 & 1) == 0) {
          in_stack_fffffffffffff9b8 = (Expr *)(in_RDI + 0x58);
          parse(in_stack_fffffffffffffa98,
                (Environment *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
                SUB21((ushort)uVar18 >> 8,0),SUB21(uVar18,0),in_stack_fffffffffffffa80,
                (string *)CONCAT44(iVar6,uVar7));
          in_stack_fffffffffffffa28 =
               (Environment *)
               Environment::addr_of_func
                         ((Environment *)
                          CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                          in_stack_fffffffffffff9d0);
          if (in_stack_fffffffffffffa28 == (Environment *)0xffffffffffffffff) {
            local_105 = 1;
          }
          in_stack_fffffffffffffa20 =
               (string *)
               Environment::def_func
                         ((Environment *)
                          CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                          in_stack_fffffffffffffb60,in_stack_fffffffffffffb58._M_current,
                          in_stack_fffffffffffffb50);
          local_3f8 = in_stack_fffffffffffffa20;
          lVar14 = std::__cxx11::string::size();
          if (lVar14 != 0) {
            std::__cxx11::string::operator=((string *)(in_RDI + 0x58),(string *)(in_RDI + 0x188));
          }
          Expr::~Expr((Expr *)0x13e482);
        }
        else {
          std::operator+(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
          std::operator+(in_stack_fffffffffffff9c8,(char *)in_stack_fffffffffffff9c0);
          std::__cxx11::string::operator=((string *)(in_RDI + 0x58),local_3b8);
          std::__cxx11::string::~string(local_3b8);
          std::__cxx11::string::~string(local_3d8);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff9d0);
        std::__cxx11::string::~string(local_2d0);
      }
      else if ((uVar7 == 0x80) || (uVar7 == 0x88)) {
        in_stack_fffffffffffff9b8 = (Expr *)(in_RDI + 0x58);
        local_105 = anon_unknown_10::parse_polyline_expr
                              (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                               in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
                               in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c,
                               in_stack_fffffffffffffba0);
        if (local_104 == 0x88) {
          sVar10 = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::size
                             (&local_a0->exprs);
          if (sVar10 != 4) {
            std::__cxx11::string::operator=
                      ((string *)(in_RDI + 0x58),"Illegal %rect. Syntax: %rect (ax, ay) (bx, by)\n")
            ;
          }
        }
      }
      else {
        cVar1 = (char)&stack0xfffffffffffff9c0;
        if (uVar7 == 0x90) {
          local_1c0 = std::__cxx11::string::find(cVar1 + -0x80,0x40);
          if (local_1c0 == -1) {
            std::__cxx11::string::operator=
                      ((string *)(in_RDI + 0x58),
                       "%circ radius/center not specified. Syntax: %circ radius @ (cenx, ceny)\n");
          }
          else {
            std::__cxx11::string::substr((ulong)local_1e0,(ulong)&local_c0);
            anon_unknown_10::parse_polyline_expr
                      (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78
                       ,in_stack_fffffffffffffb74,in_stack_fffffffffffffb70,
                       in_stack_fffffffffffffb6c,in_stack_fffffffffffffba0);
            std::__cxx11::string::~string(local_1e0);
            uVar18 = (undefined2)((ulong)&local_a0->exprs >> 0x30);
            std::__cxx11::string::substr((ulong)local_218,(ulong)&local_c0);
            in_stack_fffffffffffff9b8 = (Expr *)(in_RDI + 0x58);
            parse(in_stack_fffffffffffffa98,
                  (Environment *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
                  SUB21((ushort)uVar18 >> 8,0),SUB21(uVar18,0),in_stack_fffffffffffffa80,
                  (string *)CONCAT44(iVar6,uVar7));
            std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::push_back
                      ((vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)
                       in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
            Expr::~Expr((Expr *)0x13d9cc);
            std::__cxx11::string::~string(local_218);
            sVar10 = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::size
                               (&local_a0->exprs);
            if (sVar10 != 3) {
              std::__cxx11::string::operator=
                        ((string *)(in_RDI + 0x58),
                         "Illegal %circ. Syntax: %circ radius @ (cenx, ceny)\n");
            }
          }
        }
        else if (uVar7 == 0x98) {
          local_220 = std::__cxx11::string::find(cVar1 + -0x80,0x40);
          if (local_220 == -1) {
            std::__cxx11::string::operator=
                      ((string *)(in_RDI + 0x58),
                       "%ellipse radius/center not specified. Syntax: %ellipse (rx, ry) @ (cenx, ceny)\n"
                      );
          }
          else {
            std::__cxx11::string::substr((ulong)local_240,(ulong)&local_c0);
            anon_unknown_10::parse_polyline_expr
                      (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78
                       ,in_stack_fffffffffffffb74,in_stack_fffffffffffffb70,
                       in_stack_fffffffffffffb6c,in_stack_fffffffffffffba0);
            std::__cxx11::string::~string(local_240);
            std::__cxx11::string::substr((ulong)local_260,(ulong)&local_c0);
            in_stack_fffffffffffff9b8 = (Expr *)(in_RDI + 0x58);
            anon_unknown_10::parse_polyline_expr
                      (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78
                       ,in_stack_fffffffffffffb74,in_stack_fffffffffffffb70,
                       in_stack_fffffffffffffb6c,in_stack_fffffffffffffba0);
            std::__cxx11::string::~string(local_260);
            sVar10 = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::size
                               (&local_a0->exprs);
            if (sVar10 != 4) {
              std::__cxx11::string::operator=
                        ((string *)(in_RDI + 0x58),
                         "Illegal %ellipse. Syntax: %ellipse (rx, ry) @ (cenx, ceny)\n");
            }
          }
        }
        else if (uVar7 == 0xa0) {
          local_268 = std::__cxx11::string::find(cVar1 + -0x80,0x40);
          if (local_268 == -1) {
            std::__cxx11::string::operator=
                      ((string *)(in_RDI + 0x58),
                       "%text text/position not specified. Syntax: %text text @ (x, y)\n");
          }
          else {
            std::__cxx11::string::substr((ulong)local_288,(ulong)&local_c0);
            in_stack_fffffffffffff9b8 = (Expr *)(in_RDI + 0x58);
            anon_unknown_10::parse_polyline_expr
                      (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78
                       ,in_stack_fffffffffffffb74,in_stack_fffffffffffffb70,
                       in_stack_fffffffffffffb6c,in_stack_fffffffffffffba0);
            std::__cxx11::string::~string(local_288);
            std::__cxx11::string::substr((ulong)local_2a8,(ulong)&local_c0);
            this_02 = local_2a8;
            std::__cxx11::string::operator=((string *)&local_a0->str,this_02);
            std::__cxx11::string::~string(this_02);
            util::trim((string *)0x13dd7b);
            sVar10 = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::size
                               (&local_a0->exprs);
            if (sVar10 != 2) {
              std::__cxx11::string::operator=
                        ((string *)(in_RDI + 0x58),"Illegal %text. Syntax: %text text @ (x, y)\n");
            }
          }
        }
      }
      goto LAB_0013e4bd;
    }
  }
  lVar14 = std::__cxx11::string::size();
  if (lVar14 == 1) {
    pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)&local_e0);
    cVar1 = *pcVar11;
    cVar4 = anon_unknown_10::result_var_name_for_type(local_a0->type);
    if (cVar1 != cVar4) goto LAB_0013d597;
    psVar19 = &local_c0;
  }
  else {
LAB_0013d597:
    psVar19 = &local_e0;
  }
  in_stack_fffffffffffff9b8 = (Expr *)(in_RDI + 0x58);
  parse(psVar19,(Environment *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
        SUB21((ushort)uVar18 >> 8,0),SUB21(uVar18,0),in_stack_fffffffffffffa80,
        (string *)CONCAT44(iVar6,uVar7));
  Expr::operator=((Expr *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  Expr::~Expr((Expr *)0x13d613);
LAB_0013e4bd:
  bVar5 = Expr::is_null((Expr *)in_stack_fffffffffffff9d0);
  if (bVar5) {
    Expr::ASTNode::ASTNode((ASTNode *)&stack0xfffffffffffffb68,null);
    pvVar12 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              operator[](&(local_a0->diff).ast,0);
    *(ulong *)pvVar12 = CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68);
    aVar2.call_info[1] = in_stack_fffffffffffffb74;
    aVar2.call_info[0] = in_stack_fffffffffffffb70;
    pvVar12->field_1 = aVar2;
  }
  else {
    if ((local_104 != 0x28) && (local_104 != 0x40)) {
      Expr::optimize((Expr *)in_stack_fffffffffffffa30,
                     (int)((ulong)in_stack_fffffffffffffa28 >> 0x20));
    }
    if ((local_104 == 0) || (local_104 == 8)) {
      if (local_104 == 8) {
        local_5e8 = *(uint *)(in_RDI + 0x314);
      }
      else {
        local_5e8 = *(uint *)(in_RDI + 0x310);
      }
      local_400 = (ulong)local_5e8;
      Expr::diff((Expr *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                 (uint64_t)in_stack_fffffffffffffb60,
                 (Environment *)in_stack_fffffffffffffb58._M_current);
      Expr::operator=((Expr *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      Expr::~Expr((Expr *)0x13e5c3);
      bVar5 = Expr::is_null((Expr *)in_stack_fffffffffffff9d0);
      if (bVar5) {
        Expr::ASTNode::ASTNode((ASTNode *)(local_458 + 0x18),null);
        pvVar12 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
                  operator[](&(local_a0->ddiff).ast,0);
        *(undefined8 *)pvVar12 = local_458._24_8_;
        pvVar12->field_1 = local_438;
      }
      else {
        Expr::diff((Expr *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                   (uint64_t)in_stack_fffffffffffffb60,
                   (Environment *)in_stack_fffffffffffffb58._M_current);
        Expr::operator=((Expr *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
        Expr::~Expr((Expr *)0x13e645);
      }
      Expr::constant((double)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
      Expr::operator/((Expr *)in_stack_fffffffffffff9c8,(Expr *)in_stack_fffffffffffff9c0);
      in_stack_fffffffffffffa00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458;
      Expr::operator=((Expr *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      Expr::~Expr((Expr *)0x13e6ec);
      Expr::~Expr((Expr *)0x13e6f9);
      Expr::optimize((Expr *)in_stack_fffffffffffffa30,
                     (int)((ulong)in_stack_fffffffffffffa28 >> 0x20));
      Expr::diff((Expr *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                 (uint64_t)in_stack_fffffffffffffb60,
                 (Environment *)in_stack_fffffffffffffb58._M_current);
      Expr::operator=((Expr *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      Expr::~Expr((Expr *)0x13e772);
    }
  }
  psVar19 = (string *)&local_a0->exprs;
  expr_02 = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::begin
                      ((vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)
                       in_stack_fffffffffffff9b8);
  arg_bindings = std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::end
                           ((vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *)
                            in_stack_fffffffffffff9b8);
  while( true ) {
    bVar5 = __gnu_cxx::operator!=
                      ((__normal_iterator<nivalis::Expr_*,_std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>_>
                        *)in_stack_fffffffffffff9c0,
                       (__normal_iterator<nivalis::Expr_*,_std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>_>
                        *)in_stack_fffffffffffff9b8);
    if (!bVar5) break;
    local_4b8 = __gnu_cxx::
                __normal_iterator<nivalis::Expr_*,_std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>_>
                ::operator*((__normal_iterator<nivalis::Expr_*,_std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>_>
                             *)&stack0xfffffffffffffb58);
    Expr::optimize((Expr *)in_stack_fffffffffffffa30,(int)((ulong)in_stack_fffffffffffffa28 >> 0x20)
                  );
    __gnu_cxx::
    __normal_iterator<nivalis::Expr_*,_std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>_>
    ::operator++((__normal_iterator<nivalis::Expr_*,_std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>_>
                  *)&stack0xfffffffffffffb58);
  }
  if ((local_104 == 0) || (local_104 == 8)) {
    puVar13 = (iterator)
              Environment::addr_of_func
                        ((Environment *)
                         CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                         in_stack_fffffffffffff9d0);
    if (puVar13 == (iterator)0xffffffffffffffff) {
      local_105 = 1;
    }
    this_01 = &local_a0->expr;
    if (local_104 == 8) {
      uVar7 = *(uint *)(in_RDI + 0x314);
    }
    else {
      uVar7 = *(uint *)(in_RDI + 0x310);
    }
    local_4e9._1_8_ = ZEXT48(uVar7);
    local_4e9._9_8_ = local_4e9 + 1;
    local_4e9._17_8_ = 1;
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4e9;
    __a = local_a0;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x13e95e);
    __l._M_len = (size_type)in_stack_fffffffffffffa00;
    __l._M_array = puVar13;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,__l,
               (allocator_type *)__a);
    Environment::def_func
              ((Environment *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),psVar19,
               expr_02._M_current,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)arg_bindings._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_00);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x13e9ba);
    lVar14 = std::__cxx11::string::size();
    if (lVar14 != 0) {
      std::__cxx11::string::operator=((string *)(in_RDI + 0x58),(string *)(in_RDI + 0x188));
    }
  }
  else if (local_104 != 0x40) {
    uVar9 = Environment::addr_of_func
                      ((Environment *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                       in_stack_fffffffffffff9d0);
    if (uVar9 != 0xffffffffffffffff) {
      Environment::del_func(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
      local_105 = 1;
    }
  }
  if ((local_105 & 1) != 0) {
    local_4f8 = (Plotter *)0x0;
    while( true ) {
      pPVar17 = local_4f8;
      pPVar15 = (Plotter *)
                std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                          ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                           (in_RDI + 0x40));
      if (pPVar15 <= pPVar17) break;
      if (local_4f8 != in_RSI) {
        reparse_expr(in_RSI,in_stack_ffffffffffffffe8);
      }
      local_4f8 = (Plotter *)&local_4f8->field_0x1;
    }
  }
  in_RDI[0x2b0] = 0;
  in_RDI[0xe1] = 1;
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

void Plotter::reparse_expr(size_t idx) {
    // Re-register some special vars, just in case they got deleted
    x_var = env.addr_of("x", false);
    y_var = env.addr_of("y", false);
    t_var = env.addr_of("t", false);

    auto& func = funcs[idx];
    func_error.clear();
    func.exprs.clear();
    std::string lhs, rhs;
    func.type = detect_func_type(use_latex ? latex_to_nivalis(func.expr_str) : func.expr_str, lhs, rhs);

    int ftype_nomod = func.type & ~Function::FUNC_TYPE_MOD_ALL;
    bool want_reparse_all = false;
    switch(ftype_nomod) {
        case Function::FUNC_TYPE_EXPLICIT:
        case Function::FUNC_TYPE_EXPLICIT_Y:
        case Function::FUNC_TYPE_POLAR:
            func.expr = parse((rhs.size() == 1 &&
                            rhs[0] == result_var_name_for_type(func.type)) ?
                            lhs : rhs,
                        env,
                        true, // mode explicit
                        true, // quiet
                        0, &func_error);
            break;
        case Function::FUNC_TYPE_IMPLICIT:
            func.expr = parse("(" + lhs + ")-(" + rhs + ")",
                    env, true, true, 0, &func_error);
            break;
        case Function::FUNC_TYPE_GEOM_POLYLINE:
        case Function::FUNC_TYPE_GEOM_RECT:
            // This is either polyline or parametric
            {
                // New variable may have been registered implicitly:
                // (a,b) creates variables a,b
                // so possibly have to reparse all
                want_reparse_all = parse_polyline_expr(lhs, func, env,
                        x_var, y_var, t_var, func_error);
                if (ftype_nomod == Function::FUNC_TYPE_GEOM_RECT && func.exprs.size() != 4) {
                    func_error = "Illegal %rect. Syntax: %rect (ax, ay) (bx, by)\n";
                }
            }
            break;
        case Function::FUNC_TYPE_GEOM_CIRCLE:
            {
                size_t rad_end_pos = lhs.find('@');
                if (rad_end_pos == std::string::npos) {
                    func_error = "%circ radius/center not specified. Syntax: %circ radius @ (cenx, ceny)\n";
                } else {
                    parse_polyline_expr(lhs.substr(rad_end_pos + 1), func, env,
                            x_var, y_var, t_var, func_error);
                    func.exprs.push_back(parse(lhs.substr(0, rad_end_pos), env, true, true, 0, &func_error));
                    if (func.exprs.size() != 3) {
                        func_error = "Illegal %circ. Syntax: %circ radius @ (cenx, ceny)\n";
                    }
                }
            }
            break;
        case Function::FUNC_TYPE_GEOM_ELLIPSE:
            {
                size_t rad_end_pos = lhs.find('@');
                if (rad_end_pos == std::string::npos) {
                    func_error = "%ellipse radius/center not specified. Syntax: %ellipse (rx, ry) @ (cenx, ceny)\n";
                } else {
                    parse_polyline_expr(lhs.substr(rad_end_pos + 1), func, env,
                            x_var, y_var, t_var, func_error);
                    parse_polyline_expr(lhs.substr(0, rad_end_pos), func, env,
                            x_var, y_var, t_var, func_error);
                    if (func.exprs.size() != 4) {
                        func_error = "Illegal %ellipse. Syntax: %ellipse (rx, ry) @ (cenx, ceny)\n";
                    }
                }
            }
            break;
        case Function::FUNC_TYPE_GEOM_TEXT:
            {
                size_t rad_end_pos = lhs.find('@');
                if (rad_end_pos == std::string::npos) {
                    func_error = "%text text/position not specified. Syntax: %text text @ (x, y)\n";
                } else {
                    parse_polyline_expr(lhs.substr(rad_end_pos + 1), func, env,
                            x_var, y_var, t_var, func_error);
                    func.str = lhs.substr(0, rad_end_pos);
                    util::trim(func.str);
                    if (func.exprs.size() != 2) {
                        func_error = "Illegal %text. Syntax: %text text @ (x, y)\n";
                    }
                }
            }
            break;
        case Function::FUNC_TYPE_FUNC_DEFINITION:
            {
                size_t funname_end = lhs.find('(');
                std::string funname = lhs.substr(0, funname_end);
                util::trim(funname);
                int64_t stkh = 0, last_begin = funname_end + 1;
                size_t argcount = 0, non_space_count = 0;
                std::vector<uint64_t> bindings;
                bool bad = false;
                for (int64_t i = funname_end + 1; i < lhs.size()- 1; ++i) {
                    const char cc = lhs[i];
                    if (cc == '(') {
                        ++stkh;
                    } else if (cc == ')') {
                        --stkh;
                    } else if (cc == ',') {
                        if (stkh == 0) {
                            std::string arg = lhs.substr(last_begin, i - last_begin);
                            util::trim(arg);
                            if (!util::is_varname(arg)) {
                                bad = true;
                                break;
                            }
                            auto addr = env.addr_of(arg, false);
                            bindings.push_back(addr);
                            last_begin = i+1;
                            ++argcount;
                        }
                    } else if (!std::isspace(cc)) {
                        ++non_space_count;
                    }
                }
                if (!bad && non_space_count) {
                    ++argcount;
                    std::string arg = lhs.substr(last_begin, lhs.size() - last_begin - 1);
                    util::trim(funname);
                    if (!util::is_varname(arg)) {
                        bad = true;
                    } else {
                        auto addr = env.addr_of(arg, false);
                        bindings.push_back(addr);
                    }
                } // else: function call with no args
                if (bad) {
                    func_error = "Invalid argument name in function definition " + lhs + "\n";
                } else {
                    Expr expr = parse(rhs, env, true, true, 0, &func_error);
                    if (env.addr_of_func(funname) == -1) {
                        // Since new function defined, other expressions may change meaning,
                        // so must reparse all
                        want_reparse_all = true;
                    }
                    auto addr = env.def_func(funname, expr, bindings);
                    if (env.error_msg.size()) {
                        func_error = env.error_msg;
                    }
                }
            }
            break;
    }

    if (!func.expr.is_null()) {
        // Optimize the main expression
        if (ftype_nomod != Function::FUNC_TYPE_PARAMETRIC &&
            ftype_nomod != Function::FUNC_TYPE_FUNC_DEFINITION)
            func.expr.optimize();

        // Compute derivatives, if explicit
        if (ftype_nomod == Function::FUNC_TYPE_EXPLICIT ||
            ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y) {
            uint64_t var = ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y ?  y_var : x_var;
            func.diff = func.expr.diff(var, env);
            if (!func.diff.is_null()) {
                func.ddiff = func.diff.diff(var, env);
            }
            else func.ddiff.ast[0] = OpCode::null;
            func.recip = Expr::constant(1.) / func.expr;
            func.recip.optimize();
            func.drecip = func.recip.diff(var, env);
        }
    } else func.diff.ast[0] = OpCode::null;

    // Optimize any polyline/parametric point expressions
    for (auto& point_expr : func.exprs) {
        point_expr.optimize();
    }

    if (ftype_nomod == Function::FUNC_TYPE_EXPLICIT
        || ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y) {
        if (env.addr_of_func(func.name) == -1) {
            want_reparse_all = true;
        }
        // Register a function in env
        env.def_func(func.name, func.expr, { ftype_nomod == Function::FUNC_TYPE_EXPLICIT_Y ? y_var : x_var });
        if (env.error_msg.size()) {
            func_error = env.error_msg;
        }
    } else if (ftype_nomod != Function::FUNC_TYPE_FUNC_DEFINITION) {
        if (env.addr_of_func(func.name) != -1) {
            env.del_func(func.name);
            want_reparse_all = true;
        }
    }

    if (want_reparse_all) {
        // Possibly re-parse other expressions
        for (size_t i = 0; i < funcs.size(); ++i) {
            if (i != idx) {
                reparse_expr(i);
            }
        }
    }
    loss_detail = false;
    require_update = true;
}